

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManDemiterDual(Gia_Man_t *p,Gia_Man_t **pp0,Gia_Man_t **pp1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  Gia_Man_t *pNew;
  Vec_Int_t *vNodes;
  int fOdd;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t **pp1_local;
  Gia_Man_t **pp0_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x11e8,"int Gia_ManDemiterDual(Gia_Man_t *, Gia_Man_t **, Gia_Man_t **)");
  }
  iVar1 = Gia_ManCoNum(p);
  if (iVar1 % 2 == 0) {
    *pp1 = (Gia_Man_t *)0x0;
    *pp0 = (Gia_Man_t *)0x0;
    for (vNodes._0_4_ = 0; (int)(uint)vNodes < 2; vNodes._0_4_ = (uint)vNodes + 1) {
      p_00 = Gia_ManCollectReach(p,(uint)vNodes);
      iVar1 = Gia_ManCiNum(p);
      iVar2 = Vec_IntSize(p_00);
      iVar3 = Gia_ManCoNum(p);
      p_01 = Gia_ManStart(iVar1 + 1 + iVar2 + iVar3 / 2);
      pcVar5 = Abc_UtilStrsav(p->pName);
      p_01->pName = pcVar5;
      pcVar5 = Abc_UtilStrsav(p->pSpec);
      p_01->pSpec = pcVar5;
      pGVar6 = Gia_ManConst0(p);
      pGVar6->Value = 0;
      vNodes._4_4_ = 0;
      while( true ) {
        iVar1 = Gia_ManPiNum(p);
        bVar7 = false;
        if ((int)vNodes._4_4_ < iVar1) {
          _fOdd = Gia_ManCi(p,vNodes._4_4_);
          bVar7 = _fOdd != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar4 = Gia_ManAppendCi(p_01);
        _fOdd->Value = uVar4;
        vNodes._4_4_ = vNodes._4_4_ + 1;
      }
      vNodes._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p_00);
        bVar7 = false;
        if ((int)vNodes._4_4_ < iVar1) {
          iVar1 = Vec_IntEntry(p_00,vNodes._4_4_);
          _fOdd = Gia_ManObj(p,iVar1);
          bVar7 = _fOdd != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjFanin0Copy(_fOdd);
        iVar2 = Gia_ObjFanin1Copy(_fOdd);
        uVar4 = Gia_ManAppendAnd(p_01,iVar1,iVar2);
        _fOdd->Value = uVar4;
        vNodes._4_4_ = vNodes._4_4_ + 1;
      }
      vNodes._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar7 = false;
        if ((int)vNodes._4_4_ < iVar1) {
          _fOdd = Gia_ManCo(p,vNodes._4_4_);
          bVar7 = _fOdd != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        if ((vNodes._4_4_ & 1) == (uint)vNodes) {
          iVar1 = Gia_ObjFanin0Copy(_fOdd);
          Gia_ManAppendCo(p_01,iVar1);
        }
        vNodes._4_4_ = vNodes._4_4_ + 1;
      }
      Vec_IntFree(p_00);
      if ((uint)vNodes == 0) {
        *pp0 = p_01;
      }
      else {
        *pp1 = p_01;
      }
    }
    return 1;
  }
  __assert_fail("Gia_ManCoNum(p) % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x11e9,"int Gia_ManDemiterDual(Gia_Man_t *, Gia_Man_t **, Gia_Man_t **)");
}

Assistant:

int Gia_ManDemiterDual( Gia_Man_t * p, Gia_Man_t ** pp0, Gia_Man_t ** pp1 )
{
    Gia_Obj_t * pObj;
    int i, fOdd;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCoNum(p) % 2 == 0 );
    *pp0 = *pp1 = NULL;
    for ( fOdd = 0; fOdd < 2; fOdd++ )
    {
        Vec_Int_t * vNodes = Gia_ManCollectReach( p, fOdd );
        Gia_Man_t * pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Vec_IntSize(vNodes) + Gia_ManCoNum(p)/2 );
        pNew->pName = Abc_UtilStrsav( p->pName );
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
        Gia_ManConst0(p)->Value = 0;
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachObjVec( vNodes, p, pObj, i )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            if ( (i & 1) == fOdd )
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Vec_IntFree( vNodes );
        if ( fOdd )
            *pp1 = pNew;
        else
            *pp0 = pNew;
    }
    return 1;
}